

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O2

void __thiscall mp::NLSuffix::~NLSuffix(NLSuffix *this)

{
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->values_).super__Vector_base<double,_std::allocator<double>_>);
  std::__cxx11::string::~string((string *)&this->table_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

NLSuffix(std::string name, int kind, std::vector<double> v={})
    : name_(std::move(name)), table_({}), kind_(kind),
      values_(std::move(v)) { }